

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrCex.c
# Opt level: O2

Abc_Cex_t *
Aig_ManVerifyUsingBddsCountExample
          (Aig_Man_t *p,DdManager *dd,DdNode **pbParts,Vec_Ptr_t *vOnionRings,DdNode *bCubeFirst,
          int iOutput,int fVerbose,int fSilent)

{
  long lVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Abc_Cex_t *p_00;
  DdNode *pDVar5;
  Bbr_ImageTree_t *pTree;
  char *string;
  DdNode *pDVar6;
  DdNode *n;
  abctime aVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint __line;
  
  aVar4 = Abc_Clock();
  p_00 = Abc_CexAlloc(p->nRegs,p->nTruePis,vOnionRings->nSize + 1);
  iVar8 = vOnionRings->nSize;
  p_00->iFrame = iVar8;
  p_00->iPo = iOutput;
  iVar2 = p->nRegs;
  iVar3 = p->nTruePis;
  iVar9 = iVar3 + iVar2;
  pDVar5 = Bbr_bddComputeRangeCube(dd,iVar9,iVar9 + iVar2);
  Cudd_Ref(pDVar5);
  pTree = Bbr_bddImageStart(dd,pDVar5,p->nRegs,pbParts,p->nTruePis + p->nRegs,dd->vars,100000000,
                            fVerbose);
  Cudd_RecursiveDeref(dd,pDVar5);
  if (pTree == (Bbr_ImageTree_t *)0x0) {
    if (fSilent == 0) {
      printf("BDDs blew up during qualitification scheduling.  ");
    }
    return (Abc_Cex_t *)0x0;
  }
  string = (char *)malloc((long)dd->size);
  iVar9 = Cudd_bddPickOneCube(dd,bCubeFirst,string);
  if (iVar9 == 0) {
    __line = 0x53;
LAB_0074c6ca:
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrCex.c"
                  ,__line,
                  "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                 );
  }
  iVar2 = iVar3 * iVar8 + iVar2;
  for (lVar11 = 0; iVar8 = p->nTruePis, lVar11 < iVar8; lVar11 = lVar11 + 1) {
    Vec_PtrEntry(p->vCis,(int)lVar11);
    if (string[lVar11] == '\x01') {
      iVar8 = iVar2 + (int)lVar11;
      (&p_00[1].iPo)[iVar8 >> 5] = (&p_00[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
    }
  }
  pDVar5 = dd->one;
  Cudd_Ref(pDVar5);
  for (lVar11 = 0; iVar3 = (int)lVar11, iVar3 < p->nRegs; lVar11 = lVar11 + 1) {
    Vec_PtrEntry(p->vCis,p->nTruePis + iVar3);
    pDVar6 = Cudd_bddAnd(dd,pDVar5,
                         (DdNode *)
                         ((ulong)(string[lVar11 + p->nTruePis] != '\x01') ^
                         (ulong)dd->vars[p->nRegs + p->nTruePis + iVar3]));
    Cudd_Ref(pDVar6);
    Cudd_RecursiveDeref(dd,pDVar5);
    pDVar5 = pDVar6;
  }
  iVar2 = iVar2 - iVar8;
  iVar8 = vOnionRings->nSize;
  while( true ) {
    if (iVar8 < 1) goto LAB_0074c616;
    iVar8 = iVar8 + -1;
    pDVar6 = (DdNode *)Vec_PtrEntry(vOnionRings,iVar8);
    n = Bbr_bddImageCompute(pTree,pDVar5);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar5);
      if (fSilent == 0) {
        printf("BDDs blew up during image computation.  ");
      }
      Bbr_bddImageTreeDelete(pTree);
      free(string);
      return (Abc_Cex_t *)0x0;
    }
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar5);
    pDVar5 = Cudd_bddAnd(dd,n,pDVar6);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,n);
    iVar3 = Cudd_bddPickOneCube(dd,pDVar5,string);
    if (iVar3 == 0) {
      __line = 0x7b;
      goto LAB_0074c6ca;
    }
    Cudd_RecursiveDeref(dd,pDVar5);
    lVar11 = 0;
    while( true ) {
      lVar10 = (long)p->nTruePis;
      if (lVar10 <= lVar11) break;
      Vec_PtrEntry(p->vCis,(int)lVar11);
      if (string[lVar11] == '\x01') {
        iVar3 = iVar2 + (int)lVar11;
        (&p_00[1].iPo)[iVar3 >> 5] = (&p_00[1].iPo)[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
      }
      lVar11 = lVar11 + 1;
    }
    if (iVar8 == 0) break;
    iVar2 = iVar2 - p->nTruePis;
    pDVar5 = dd->one;
    Cudd_Ref(pDVar5);
    for (lVar11 = 0; iVar3 = (int)lVar11, iVar3 < p->nRegs; lVar11 = lVar11 + 1) {
      Vec_PtrEntry(p->vCis,p->nTruePis + iVar3);
      pDVar6 = Cudd_bddAnd(dd,pDVar5,
                           (DdNode *)
                           ((ulong)(string[lVar11 + p->nTruePis] != '\x01') ^
                           (ulong)dd->vars[p->nRegs + p->nTruePis + iVar3]));
      Cudd_Ref(pDVar6);
      Cudd_RecursiveDeref(dd,pDVar5);
      pDVar5 = pDVar6;
    }
  }
  lVar11 = 0;
  while ((int)lVar11 < p->nRegs) {
    Vec_PtrEntry(p->vCis,(int)lVar10 + (int)lVar11);
    lVar10 = (long)p->nTruePis;
    lVar1 = lVar11 + lVar10;
    lVar11 = lVar11 + 1;
    if (string[lVar1] != '\0') {
      __assert_fail("pValues[Saig_ManPiNum(p)+i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrCex.c"
                    ,0x88,
                    "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                   );
    }
  }
LAB_0074c616:
  Bbr_bddImageTreeDelete(pTree);
  free(string);
  iVar8 = (int)string;
  if (vOnionRings->nSize < 1000) {
    iVar2 = Saig_ManVerifyCex(p,p_00);
    iVar8 = (int)p;
    if (iVar2 == 0 && fSilent == 0) {
      iVar8 = 0x8e6c63;
      puts("Aig_ManVerifyUsingBdds(): Counter-example verification has FAILED.");
    }
  }
  if (fSilent != 0 || fVerbose == 0) {
    return p_00;
  }
  Abc_Print(iVar8,"%s =","Counter-example generation time");
  aVar7 = Abc_Clock();
  Abc_Print(iVar8,"%9.2f sec\n",(double)(aVar7 - aVar4) / 1000000.0);
  return p_00;
}

Assistant:

Abc_Cex_t * Aig_ManVerifyUsingBddsCountExample( Aig_Man_t * p, DdManager * dd, 
    DdNode ** pbParts, Vec_Ptr_t * vOnionRings, DdNode * bCubeFirst,
    int iOutput, int fVerbose, int fSilent )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Bbr_ImageTree_t * pTree;
    DdNode * bCubeNs, * bState, * bImage;
    DdNode * bTemp, * bVar, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues;
    abctime clk = Abc_Clock();
//printf( "\nDeriving counter-example.\n" );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p), Saig_ManPiNum(p), Vec_PtrSize(vOnionRings)+1 );
    pCex->iFrame = Vec_PtrSize(vOnionRings);
    pCex->iPo = iOutput;
    nPiOffset = Saig_ManRegNum(p) + Saig_ManPiNum(p) * Vec_PtrSize(vOnionRings);

    // create the cube of NS variables
    bCubeNs  = Bbr_bddComputeRangeCube( dd, Saig_ManCiNum(p), Saig_ManCiNum(p)+Saig_ManRegNum(p) );    Cudd_Ref( bCubeNs );
    pTree = Bbr_bddImageStart( dd, bCubeNs, Saig_ManRegNum(p), pbParts, Saig_ManCiNum(p), dd->vars, 100000000, fVerbose );
    Cudd_RecursiveDeref( dd, bCubeNs );
    if ( pTree == NULL )
    {
        if ( !fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return NULL;
    }

    // allocate room for the cube
    pValues = ABC_ALLOC( char, dd->size );

    // get the last cube
    RetValue = Cudd_bddPickOneCube( dd, bCubeFirst, pValues );
    assert( RetValue );

    // write PIs of counter-example
    Saig_ManForEachPi( p, pObj, i )
        if ( pValues[i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );
    nPiOffset -= Saig_ManPiNum(p);

    // write state in terms of NS variables
    bState = (dd)->one; Cudd_Ref( bState );
    Saig_ManForEachLo( p, pObj, i )
    {
        bVar = Cudd_NotCond( dd->vars[Saig_ManCiNum(p)+i], pValues[Saig_ManPiNum(p)+i] != 1 );
        bState = Cudd_bddAnd( dd, bTemp = bState, bVar );  Cudd_Ref( bState );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }

    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, vOnionRings, bRing, v )
    { 
        // compute the next states
        bImage = Bbr_bddImageCompute( pTree, bState );           
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bState );
            if ( !fSilent )
                printf( "BDDs blew up during image computation.  " );
            Bbr_bddImageTreeDelete( pTree );
            ABC_FREE( pValues );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bState );

        // intersect with the previous set
        bImage = Cudd_bddAnd( dd, bTemp = bImage, bRing );  Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( dd, bImage, pValues );
        assert( RetValue );
        Cudd_RecursiveDeref( dd, bImage );

        // write PIs of counter-example
        Saig_ManForEachPi( p, pObj, i )
            if ( pValues[i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );
        nPiOffset -= Saig_ManPiNum(p);

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p, pObj, i )
                assert( pValues[Saig_ManPiNum(p)+i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = (dd)->one; Cudd_Ref( bState );
        Saig_ManForEachLo( p, pObj, i )
        {
            bVar = Cudd_NotCond( dd->vars[Saig_ManCiNum(p)+i], pValues[Saig_ManPiNum(p)+i] != 1 );
            bState = Cudd_bddAnd( dd, bTemp = bState, bVar );  Cudd_Ref( bState );
            Cudd_RecursiveDeref( dd, bTemp ); 
        }
    }
    // cleanup
    Bbr_bddImageTreeDelete( pTree );
    ABC_FREE( pValues );
    // verify the counter example
    if ( Vec_PtrSize(vOnionRings) < 1000 )
    {
    RetValue = Saig_ManVerifyCex( p, pCex );
    if ( RetValue == 0 && !fSilent )
        printf( "Aig_ManVerifyUsingBdds(): Counter-example verification has FAILED.\n" );
    }
    if ( fVerbose && !fSilent )
    {
    ABC_PRT( "Counter-example generation time", Abc_Clock() - clk );
    }
    return pCex;
}